

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  uint uVar2;
  CURLMcode CVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  Curl_easy *data;
  bool bVar7;
  curl_socket_t sockbunch [5];
  uint local_48 [6];
  
  CVar3 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar3 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    data = multi->easyp;
    if (data == (Curl_easy *)0x0) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = 0xffffffff;
      do {
        uVar2 = multi_getsock(data,(curl_socket_t *)local_48);
        uVar4 = 0;
        do {
          uVar6 = 0xffffffff;
          if (((uVar2 >> ((uint)uVar4 & 0x1f) & 1) == 0) ||
             (uVar1 = local_48[uVar4], (int)uVar1 < 0)) {
LAB_004f122b:
            if ((((uVar2 >> ((byte)uVar4 & 0x1f)) >> 0x10 & 1) != 0) &&
               (uVar1 = local_48[uVar4], -1 < (int)uVar1)) {
              bVar7 = true;
              if (0x3ff < (int)uVar1) goto LAB_004f126d;
              write_fd_set->fds_bits[uVar1 >> 6] =
                   write_fd_set->fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
              uVar6 = uVar1;
            }
            if (uVar6 == 0xffffffff) {
              bVar7 = false;
            }
            else {
              if ((int)uVar5 < (int)uVar6) {
                uVar5 = uVar6;
              }
              bVar7 = true;
            }
          }
          else {
            bVar7 = true;
            if ((int)uVar1 < 0x400) {
              read_fd_set->fds_bits[uVar1 >> 6] =
                   read_fd_set->fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
              uVar6 = uVar1;
              goto LAB_004f122b;
            }
          }
LAB_004f126d:
        } while ((bVar7) && (bVar7 = uVar4 < 4, uVar4 = uVar4 + 1, bVar7));
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    *max_fd = uVar5;
    CVar3 = CURLM_OK;
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_easy *data;
  int this_max_fd = -1;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    int bitmap;
#ifdef __clang_analyzer_
    /* to prevent "The left operand of '>=' is a garbage value" warnings */
    memset(sockbunch, 0, sizeof(sockbunch));
#endif
    bitmap = multi_getsock(data, sockbunch);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if((bitmap & GETSOCK_READSOCK(i)) && VALID_SOCK(sockbunch[i])) {
        if(!FDSET_SOCK(sockbunch[i]))
          /* pretend it doesn't exist */
          continue;
        FD_SET(sockbunch[i], read_fd_set);
        s = sockbunch[i];
      }
      if((bitmap & GETSOCK_WRITESOCK(i)) && VALID_SOCK(sockbunch[i])) {
        if(!FDSET_SOCK(sockbunch[i]))
          /* pretend it doesn't exist */
          continue;
        FD_SET(sockbunch[i], write_fd_set);
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD)
        /* this socket is unused, break out of loop */
        break;
      if((int)s > this_max_fd)
        this_max_fd = (int)s;
    }

    data = data->next; /* check next handle */
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}